

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_11::NameApplier::UseNameForParamAndLocalVar
          (NameApplier *this,Func *func,Var *var)

{
  pointer pTVar1;
  pointer pTVar2;
  pointer pbVar3;
  pointer pcVar4;
  string_view name_00;
  Index IVar5;
  Index IVar6;
  Enum EVar7;
  int iVar8;
  char *pcVar9;
  string name;
  char *local_48;
  size_t local_40;
  char local_38 [16];
  
  IVar5 = Func::GetLocalIndex(func,var);
  pTVar1 = (func->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pTVar2 = (func->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  IVar6 = LocalTypes::size(&func->local_types);
  EVar7 = Error;
  if (IVar5 < IVar6 + (int)((ulong)((long)pTVar1 - (long)pTVar2) >> 2)) {
    pbVar3 = (this->param_and_local_index_to_name_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar4 = pbVar3[IVar5]._M_dataplus._M_p;
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar4,pcVar4 + pbVar3[IVar5]._M_string_length);
    pcVar9 = local_48;
    if (var->type_ == Name) {
      if (local_40 != (var->field_2).name_._M_string_length) {
LAB_0014b016:
        __assert_fail("name == var->name()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/apply-names.cc"
                      ,0xdb,
                      "Result wabt::(anonymous namespace)::NameApplier::UseNameForParamAndLocalVar(Func *, Var *)"
                     );
      }
      if (local_40 != 0) {
        iVar8 = bcmp(local_48,(var->field_2).name_._M_dataplus._M_p,local_40);
        if (iVar8 != 0) goto LAB_0014b016;
      }
    }
    else {
      name_00.size_ = local_40;
      name_00.data_ = local_48;
      if (local_40 != 0) {
        Var::set_name(var,name_00);
        pcVar9 = local_48;
      }
    }
    if (pcVar9 != local_38) {
      operator_delete(pcVar9);
    }
    EVar7 = Ok;
  }
  return (Result)EVar7;
}

Assistant:

Result NameApplier::UseNameForParamAndLocalVar(Func* func, Var* var) {
  Index local_index = func->GetLocalIndex(*var);
  if (local_index >= func->GetNumParamsAndLocals()) {
    return Result::Error;
  }

  std::string name = param_and_local_index_to_name_[local_index];
  if (var->is_name()) {
    assert(name == var->name());
    return Result::Ok;
  }

  if (!name.empty()) {
    var->set_name(name);
  }
  return Result::Ok;
}